

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O2

int __thiscall cmCPackExternalGenerator::InitializeInternal(cmCPackExternalGenerator *this)

{
  cmCPackExternalVersionGenerator *pcVar1;
  cmCPackLog *this_00;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  char *__s;
  ostream *poVar5;
  allocator<char> local_1b1;
  string local_1b0;
  cmCPackExternalGenerator *local_190;
  string major;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&major,"CPACK_EXTERNAL_KNOWN_VERSIONS",(allocator<char> *)&local_1b0);
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&major,"1.0");
  std::__cxx11::string::~string((string *)&major);
  bVar3 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackExternal.cmake");
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"CPACK_EXTERNAL_SELECTED_MAJOR",(allocator<char> *)&local_190);
    __s = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1b0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&major,__s,&local_1b1);
    std::__cxx11::string::~string((string *)&local_1b0);
    bVar3 = std::operator==(&major,"1");
    if (bVar3) {
      local_190 = this;
      std::
      make_unique<cmCPackExternalGenerator::cmCPackExternalVersion1Generator,cmCPackExternalGenerator*>
                ((cmCPackExternalGenerator **)&local_1b0);
      _Var2._M_p = local_1b0._M_dataplus._M_p;
      local_1b0._M_dataplus._M_p = (pointer)0x0;
      pcVar1 = (this->Generator)._M_t.
               super___uniq_ptr_impl<cmCPackExternalGenerator::cmCPackExternalVersionGenerator,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
               .
               super__Head_base<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_false>
               ._M_head_impl;
      (this->Generator)._M_t.
      super___uniq_ptr_impl<cmCPackExternalGenerator::cmCPackExternalVersionGenerator,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
      .super__Head_base<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_false>.
      _M_head_impl = (cmCPackExternalVersionGenerator *)_Var2._M_p;
      if (pcVar1 != (cmCPackExternalVersionGenerator *)0x0) {
        (*pcVar1->_vptr_cmCPackExternalVersionGenerator[1])();
        if ((cmCPackExternalVersionGenerator *)local_1b0._M_dataplus._M_p !=
            (cmCPackExternalVersionGenerator *)0x0) {
          (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
        }
      }
    }
    iVar4 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
    std::__cxx11::string::~string((string *)&major);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&major);
    poVar5 = std::operator<<((ostream *)&major,"Error while executing CPackExternal.cmake");
    std::endl<char,std::char_traits<char>>(poVar5);
    this_00 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackExternalGenerator.cxx"
                    ,0x1a,local_1b0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&major);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int cmCPackExternalGenerator::InitializeInternal()
{
  this->SetOption("CPACK_EXTERNAL_KNOWN_VERSIONS", "1.0");

  if (!this->ReadListFile("Internal/CPack/CPackExternal.cmake")) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while executing CPackExternal.cmake" << std::endl);
    return 0;
  }

  std::string major = this->GetOption("CPACK_EXTERNAL_SELECTED_MAJOR");
  if (major == "1") {
    this->Generator = cm::make_unique<cmCPackExternalVersion1Generator>(this);
  }

  return this->Superclass::InitializeInternal();
}